

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O1

sU32 ryg_dxt::MatchColorsBlock(Pixel *block,Pixel *color,sBool dither)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  sInt i_2;
  int iVar9;
  int iVar10;
  int *piVar11;
  int iVar12;
  sInt i;
  long lVar13;
  int iVar14;
  int *piVar15;
  int iVar16;
  bool bVar17;
  int local_98 [4];
  int aiStack_88 [6];
  sInt stops [4];
  sInt dots [16];
  sInt err [8];
  
  iVar7 = (uint)(color->field_0).r - (uint)*(byte *)((long)color + 6);
  iVar9 = (uint)(color->field_0).g - (uint)*(byte *)((long)color + 5);
  iVar12 = (uint)(color->field_0).b - (uint)color[1].field_0.b;
  lVar13 = 0;
  do {
    aiStack_88[lVar13] =
         (uint)block[lVar13].field_0.b * iVar12 +
         (uint)*(byte *)((long)block + lVar13 * 4 + 1) * iVar9 +
         (uint)*(byte *)((long)block + lVar13 * 4 + 2) * iVar7;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x10);
  lVar13 = 0;
  do {
    local_98[lVar13] =
         (uint)color[lVar13].field_0.b * iVar12 +
         (uint)*(byte *)((long)color + lVar13 * 4 + 1) * iVar9 +
         (uint)*(byte *)((long)color + lVar13 * 4 + 2) * iVar7;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  iVar12 = local_98[1] + local_98[3] >> 1;
  iVar9 = local_98[3] + local_98[2] >> 1;
  iVar7 = local_98[2] + local_98[0] >> 1;
  if (dither) {
    iVar9 = iVar9 * 0x10;
    dots[10] = 0;
    dots[0xb] = 0;
    dots[0xc] = 0;
    dots[0xd] = 0;
    dots[6] = 0;
    dots[7] = 0;
    dots[8] = 0;
    dots[9] = 0;
    iVar12 = iVar12 * 0x10;
    iVar7 = iVar7 * 0x10;
    lVar13 = 0;
    uVar8 = 0;
    piVar6 = dots + 6;
    piVar15 = dots + 10;
    do {
      piVar11 = piVar6;
      iVar16 = *(int *)((long)aiStack_88 + lVar13 * 2);
      iVar10 = *piVar15;
      iVar14 = iVar10 * 5 + piVar15[1] * 3 + iVar16 * 0x10;
      uVar2 = (uint)(iVar12 <= iVar14) * 2 + 1;
      if (iVar9 <= iVar14) {
        uVar2 = (uint)(iVar14 < iVar7) * 2;
      }
      iVar16 = iVar16 - local_98[uVar2];
      *piVar11 = iVar16;
      iVar14 = *(int *)((long)aiStack_88 + lVar13 * 2 + 4);
      iVar1 = piVar15[1];
      iVar16 = iVar14 * 0x10 + iVar10 + piVar15[2] * 3 + iVar1 * 5 + iVar16 * 7;
      uVar3 = (uint)(iVar12 <= iVar16) * 2 + 1;
      if (iVar9 <= iVar16) {
        uVar3 = (uint)(iVar16 < iVar7) * 2;
      }
      iVar14 = iVar14 - local_98[uVar3];
      piVar11[1] = iVar14;
      iVar16 = *(int *)((long)aiStack_88 + lVar13 * 2 + 8);
      iVar10 = piVar15[2];
      iVar14 = iVar16 * 0x10 + iVar1 + piVar15[3] * 3 + iVar10 * 5 + iVar14 * 7;
      uVar4 = (uint)(iVar12 <= iVar14) * 2 + 1;
      if (iVar9 <= iVar14) {
        uVar4 = (uint)(iVar14 < iVar7) * 2;
      }
      iVar16 = iVar16 - local_98[uVar4];
      piVar11[2] = iVar16;
      iVar14 = *(int *)((long)aiStack_88 + lVar13 * 2 + 0xc);
      iVar16 = iVar14 * 0x10 + iVar10 + piVar15[3] * 5 + iVar16 * 7;
      uVar5 = (uint)(iVar12 <= iVar16) * 2 + 1;
      if (iVar9 <= iVar16) {
        uVar5 = (uint)(iVar16 < iVar7) * 2;
      }
      piVar11[3] = iVar14 - local_98[uVar5];
      uVar8 = uVar8 | (uVar5 << 6 | uVar4 * 0x10 + uVar3 * 4 | uVar2) << ((byte)lVar13 & 0x1f);
      lVar13 = lVar13 + 8;
      piVar6 = piVar15;
      piVar15 = piVar11;
    } while ((int)lVar13 != 0x20);
  }
  else {
    uVar8 = 0;
    lVar13 = 0xf;
    do {
      iVar16 = aiStack_88[lVar13];
      iVar10 = (iVar12 <= iVar16) + 1 + (uint)(iVar12 <= iVar16);
      if (iVar9 <= iVar16) {
        iVar10 = (uint)(iVar16 < iVar7) * 2;
      }
      uVar8 = iVar10 + uVar8 * 4;
      bVar17 = lVar13 != 0;
      lVar13 = lVar13 + -1;
    } while (bVar17);
  }
  return uVar8;
}

Assistant:

static sU32 MatchColorsBlock(const Pixel* block, const Pixel* color, sBool dither) {
  sU32 mask = 0;
  sInt dirr = color[0].r - color[1].r;
  sInt dirg = color[0].g - color[1].g;
  sInt dirb = color[0].b - color[1].b;

  sInt dots[16];
  for (sInt i = 0; i < 16; i++)
    dots[i] = block[i].r * dirr + block[i].g * dirg + block[i].b * dirb;

  sInt stops[4];
  for (sInt i = 0; i < 4; i++)
    stops[i] = color[i].r * dirr + color[i].g * dirg + color[i].b * dirb;

  sInt c0Point = (stops[1] + stops[3]) >> 1;
  sInt halfPoint = (stops[3] + stops[2]) >> 1;
  sInt c3Point = (stops[2] + stops[0]) >> 1;

  if (!dither) {
    // the version without dithering is straightforward
    for (sInt i = 15; i >= 0; i--) {
      mask <<= 2;
      sInt dot = dots[i];

      if (dot < halfPoint)
        mask |= (dot < c0Point) ? 1 : 3;
      else
        mask |= (dot < c3Point) ? 2 : 0;
    }
  } else {
    // with floyd-steinberg dithering (see above)
    sInt err[8], *ep1 = err, *ep2 = err + 4;
    sInt* dp = dots;

    c0Point <<= 4;
    halfPoint <<= 4;
    c3Point <<= 4;
    for (sInt i = 0; i < 8; i++)
      err[i] = 0;

    for (sInt y = 0; y < 4; y++) {
      sInt dot, lmask, step;

      // pixel 0
      dot = (dp[0] << 4) + (3 * ep2[1] + 5 * ep2[0]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[0] = dp[0] - stops[step];
      lmask = step;

      // pixel 1
      dot = (dp[1] << 4) + (7 * ep1[0] + 3 * ep2[2] + 5 * ep2[1] + ep2[0]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[1] = dp[1] - stops[step];
      lmask |= step << 2;

      // pixel 2
      dot = (dp[2] << 4) + (7 * ep1[1] + 3 * ep2[3] + 5 * ep2[2] + ep2[1]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[2] = dp[2] - stops[step];
      lmask |= step << 4;

      // pixel 3
      dot = (dp[3] << 4) + (7 * ep1[2] + 5 * ep2[3] + ep2[2]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[3] = dp[3] - stops[step];
      lmask |= step << 6;

      // advance to next line
      sSwap(ep1, ep2);
      dp += 4;
      mask |= lmask << (y * 8);
    }
  }

  return mask;
}